

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::Builtins::registerMathFuncs(Builtins *this)

{
  shared_ptr<slang::ast::builtins::BooleanBitVectorFunction> *in_stack_fffffffffffffa08;
  shared_ptr<slang::ast::SystemSubroutine> *in_stack_fffffffffffffa10;
  shared_ptr<slang::ast::SystemSubroutine> *this_00;
  BVFKind *in_stack_fffffffffffffa30;
  KnownSystemName *__args_1;
  Builtins *in_stack_fffffffffffffa38;
  Builtins *__args;
  shared_ptr<slang::ast::SystemSubroutine> *in_stack_fffffffffffffaa0;
  shared_ptr<slang::ast::SystemSubroutine> *subroutine;
  Builtins *in_stack_fffffffffffffaa8;
  Builtins *this_01;
  shared_ptr<slang::ast::SystemSubroutine> local_430 [2];
  undefined4 local_40c;
  undefined4 local_3e4;
  KnownSystemName local_3e0 [4];
  undefined1 local_3d0 [280];
  undefined4 local_2a4;
  bool local_27c;
  bool bStack_27b;
  undefined2 uStack_27a;
  undefined4 local_254;
  undefined4 local_22c;
  undefined4 local_204;
  undefined4 local_1dc;
  undefined4 local_1b4;
  undefined4 local_18c;
  undefined4 local_164;
  undefined4 local_13c;
  undefined4 local_114;
  undefined4 local_f0;
  undefined4 local_ec;
  bitwidth_t local_c8;
  bool local_c4;
  bool bStack_c3;
  undefined2 uStack_c2;
  undefined4 local_a0;
  undefined4 local_9c;
  
  std::make_shared<slang::ast::builtins::Clog2Function>();
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::Clog2Function,void>
            (in_stack_fffffffffffffa10,
             (shared_ptr<slang::ast::builtins::Clog2Function> *)in_stack_fffffffffffffa08);
  addSystemSubroutine(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x763ad5);
  std::shared_ptr<slang::ast::builtins::Clog2Function>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::Clog2Function> *)0x763ae2);
  std::make_shared<slang::ast::builtins::CountBitsFunction>();
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::CountBitsFunction,void>
            (in_stack_fffffffffffffa10,
             (shared_ptr<slang::ast::builtins::CountBitsFunction> *)in_stack_fffffffffffffa08);
  addSystemSubroutine(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x763b38);
  std::shared_ptr<slang::ast::builtins::CountBitsFunction>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::CountBitsFunction> *)0x763b45);
  std::make_shared<slang::ast::builtins::CountOnesFunction>();
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::CountOnesFunction,void>
            (in_stack_fffffffffffffa10,
             (shared_ptr<slang::ast::builtins::CountOnesFunction> *)in_stack_fffffffffffffa08);
  addSystemSubroutine(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x763b9b);
  std::shared_ptr<slang::ast::builtins::CountOnesFunction>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::CountOnesFunction> *)0x763ba8);
  local_9c = 0x1f;
  local_a0 = 0;
  std::
  make_shared<slang::ast::builtins::BooleanBitVectorFunction,slang::parsing::KnownSystemName,slang::ast::builtins::BooleanBitVectorFunction::BVFKind>
            ((KnownSystemName *)in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::BooleanBitVectorFunction,void>
            (in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
  addSystemSubroutine(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x763c24);
  std::shared_ptr<slang::ast::builtins::BooleanBitVectorFunction>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::BooleanBitVectorFunction> *)0x763c31);
  local_c4 = true;
  bStack_c3 = false;
  uStack_c2 = 0;
  local_c8 = 1;
  std::
  make_shared<slang::ast::builtins::BooleanBitVectorFunction,slang::parsing::KnownSystemName,slang::ast::builtins::BooleanBitVectorFunction::BVFKind>
            ((KnownSystemName *)in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::BooleanBitVectorFunction,void>
            (in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
  addSystemSubroutine(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x763cad);
  std::shared_ptr<slang::ast::builtins::BooleanBitVectorFunction>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::BooleanBitVectorFunction> *)0x763cba);
  local_ec = 0x21;
  local_f0 = 2;
  std::
  make_shared<slang::ast::builtins::BooleanBitVectorFunction,slang::parsing::KnownSystemName,slang::ast::builtins::BooleanBitVectorFunction::BVFKind>
            ((KnownSystemName *)in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::BooleanBitVectorFunction,void>
            (in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
  addSystemSubroutine(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x763d36);
  std::shared_ptr<slang::ast::builtins::BooleanBitVectorFunction>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::BooleanBitVectorFunction> *)0x763d43);
  local_114 = 0x22;
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&log>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::RealMath1Function<&log>,void>
            (in_stack_fffffffffffffa10,
             (shared_ptr<slang::ast::builtins::RealMath1Function<&log>_> *)in_stack_fffffffffffffa08
            );
  addSystemSubroutine(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x763db4);
  std::shared_ptr<slang::ast::builtins::RealMath1Function<&log>_>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::RealMath1Function<&log>_> *)0x763dc1);
  local_13c = 0x23;
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&log10>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::RealMath1Function<&log10>,void>
            (in_stack_fffffffffffffa10,
             (shared_ptr<slang::ast::builtins::RealMath1Function<&log10>_> *)
             in_stack_fffffffffffffa08);
  addSystemSubroutine(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x763e32);
  std::shared_ptr<slang::ast::builtins::RealMath1Function<&log10>_>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::RealMath1Function<&log10>_> *)0x763e3f);
  local_164 = 0x24;
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&exp>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::RealMath1Function<&exp>,void>
            (in_stack_fffffffffffffa10,
             (shared_ptr<slang::ast::builtins::RealMath1Function<&exp>_> *)in_stack_fffffffffffffa08
            );
  addSystemSubroutine(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x763eb0);
  std::shared_ptr<slang::ast::builtins::RealMath1Function<&exp>_>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::RealMath1Function<&exp>_> *)0x763ebd);
  local_18c = 0x25;
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&sqrt>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::RealMath1Function<&sqrt>,void>
            (in_stack_fffffffffffffa10,
             (shared_ptr<slang::ast::builtins::RealMath1Function<&sqrt>_> *)
             in_stack_fffffffffffffa08);
  addSystemSubroutine(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x763f2e);
  std::shared_ptr<slang::ast::builtins::RealMath1Function<&sqrt>_>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::RealMath1Function<&sqrt>_> *)0x763f3b);
  local_1b4 = 0x26;
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&floor>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::RealMath1Function<&floor>,void>
            (in_stack_fffffffffffffa10,
             (shared_ptr<slang::ast::builtins::RealMath1Function<&floor>_> *)
             in_stack_fffffffffffffa08);
  addSystemSubroutine(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x763fac);
  std::shared_ptr<slang::ast::builtins::RealMath1Function<&floor>_>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::RealMath1Function<&floor>_> *)0x763fb9);
  local_1dc = 0x27;
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&ceil>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::RealMath1Function<&ceil>,void>
            (in_stack_fffffffffffffa10,
             (shared_ptr<slang::ast::builtins::RealMath1Function<&ceil>_> *)
             in_stack_fffffffffffffa08);
  addSystemSubroutine(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x76402a);
  std::shared_ptr<slang::ast::builtins::RealMath1Function<&ceil>_>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::RealMath1Function<&ceil>_> *)0x764037);
  local_204 = 0x28;
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&sin>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::RealMath1Function<&sin>,void>
            (in_stack_fffffffffffffa10,
             (shared_ptr<slang::ast::builtins::RealMath1Function<&sin>_> *)in_stack_fffffffffffffa08
            );
  addSystemSubroutine(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x7640a8);
  std::shared_ptr<slang::ast::builtins::RealMath1Function<&sin>_>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::RealMath1Function<&sin>_> *)0x7640b5);
  local_22c = 0x29;
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&cos>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::RealMath1Function<&cos>,void>
            (in_stack_fffffffffffffa10,
             (shared_ptr<slang::ast::builtins::RealMath1Function<&cos>_> *)in_stack_fffffffffffffa08
            );
  addSystemSubroutine(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x764126);
  std::shared_ptr<slang::ast::builtins::RealMath1Function<&cos>_>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::RealMath1Function<&cos>_> *)0x764133);
  local_254 = 0x2a;
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&tan>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::RealMath1Function<&tan>,void>
            (in_stack_fffffffffffffa10,
             (shared_ptr<slang::ast::builtins::RealMath1Function<&tan>_> *)in_stack_fffffffffffffa08
            );
  addSystemSubroutine(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x7641a4);
  std::shared_ptr<slang::ast::builtins::RealMath1Function<&tan>_>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::RealMath1Function<&tan>_> *)0x7641b1);
  local_27c = true;
  bStack_27b = false;
  uStack_27a = 0;
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&asin>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::RealMath1Function<&asin>,void>
            (in_stack_fffffffffffffa10,
             (shared_ptr<slang::ast::builtins::RealMath1Function<&asin>_> *)
             in_stack_fffffffffffffa08);
  addSystemSubroutine(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x764222);
  std::shared_ptr<slang::ast::builtins::RealMath1Function<&asin>_>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::RealMath1Function<&asin>_> *)0x76422f);
  local_2a4 = 0x2c;
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&acos>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::RealMath1Function<&acos>,void>
            (in_stack_fffffffffffffa10,
             (shared_ptr<slang::ast::builtins::RealMath1Function<&acos>_> *)
             in_stack_fffffffffffffa08);
  addSystemSubroutine(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x7642a0);
  std::shared_ptr<slang::ast::builtins::RealMath1Function<&acos>_>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::RealMath1Function<&acos>_> *)0x7642ad);
  local_3d0._260_4_ = 0x2d;
  subroutine = (shared_ptr<slang::ast::SystemSubroutine> *)(local_3d0 + 0x108);
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&atan>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
  this_01 = (Builtins *)&stack0xfffffffffffffd48;
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::RealMath1Function<&atan>,void>
            (in_stack_fffffffffffffa10,
             (shared_ptr<slang::ast::builtins::RealMath1Function<&atan>_> *)
             in_stack_fffffffffffffa08);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x76431e);
  std::shared_ptr<slang::ast::builtins::RealMath1Function<&atan>_>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::RealMath1Function<&atan>_> *)0x76432b);
  local_3d0._220_4_ = 0x2e;
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&sinh>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::RealMath1Function<&sinh>,void>
            (in_stack_fffffffffffffa10,
             (shared_ptr<slang::ast::builtins::RealMath1Function<&sinh>_> *)
             in_stack_fffffffffffffa08);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x76439c);
  std::shared_ptr<slang::ast::builtins::RealMath1Function<&sinh>_>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::RealMath1Function<&sinh>_> *)0x7643a9);
  local_3d0._180_4_ = 0x2f;
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&cosh>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::RealMath1Function<&cosh>,void>
            (in_stack_fffffffffffffa10,
             (shared_ptr<slang::ast::builtins::RealMath1Function<&cosh>_> *)
             in_stack_fffffffffffffa08);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x764414);
  std::shared_ptr<slang::ast::builtins::RealMath1Function<&cosh>_>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::RealMath1Function<&cosh>_> *)0x764421);
  local_3d0._140_4_ = 0x30;
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&tanh>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::RealMath1Function<&tanh>,void>
            (in_stack_fffffffffffffa10,
             (shared_ptr<slang::ast::builtins::RealMath1Function<&tanh>_> *)
             in_stack_fffffffffffffa08);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x764486);
  std::shared_ptr<slang::ast::builtins::RealMath1Function<&tanh>_>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::RealMath1Function<&tanh>_> *)0x764493);
  local_3d0._100_4_ = 0x31;
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&asinh>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::RealMath1Function<&asinh>,void>
            (in_stack_fffffffffffffa10,
             (shared_ptr<slang::ast::builtins::RealMath1Function<&asinh>_> *)
             in_stack_fffffffffffffa08);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x7644f8);
  std::shared_ptr<slang::ast::builtins::RealMath1Function<&asinh>_>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::RealMath1Function<&asinh>_> *)0x764505);
  local_3d0._60_4_ = 0x32;
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&acosh>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::RealMath1Function<&acosh>,void>
            (in_stack_fffffffffffffa10,
             (shared_ptr<slang::ast::builtins::RealMath1Function<&acosh>_> *)
             in_stack_fffffffffffffa08);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x76456a);
  std::shared_ptr<slang::ast::builtins::RealMath1Function<&acosh>_>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::RealMath1Function<&acosh>_> *)0x764577);
  local_3d0._20_4_ = 0x33;
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&atanh>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::RealMath1Function<&atanh>,void>
            (in_stack_fffffffffffffa10,
             (shared_ptr<slang::ast::builtins::RealMath1Function<&atanh>_> *)
             in_stack_fffffffffffffa08);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x7645dc);
  std::shared_ptr<slang::ast::builtins::RealMath1Function<&atanh>_>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::RealMath1Function<&atanh>_> *)0x7645e9);
  local_3e4 = 0x34;
  __args_1 = local_3e0;
  std::
  make_shared<slang::ast::builtins::RealMath2Function<&pow>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (in_stack_fffffffffffffa38,__args_1);
  __args = (Builtins *)local_3d0;
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::RealMath2Function<&pow>,void>
            (in_stack_fffffffffffffa10,
             (shared_ptr<slang::ast::builtins::RealMath2Function<&pow>_> *)in_stack_fffffffffffffa08
            );
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x76464e);
  std::shared_ptr<slang::ast::builtins::RealMath2Function<&pow>_>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::RealMath2Function<&pow>_> *)0x76465b);
  local_40c = 0x35;
  std::
  make_shared<slang::ast::builtins::RealMath2Function<&atan2>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (__args,__args_1);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::RealMath2Function<&atan2>,void>
            (in_stack_fffffffffffffa10,
             (shared_ptr<slang::ast::builtins::RealMath2Function<&atan2>_> *)
             in_stack_fffffffffffffa08);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x7646c0);
  std::shared_ptr<slang::ast::builtins::RealMath2Function<&atan2>_>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::RealMath2Function<&atan2>_> *)0x7646cd);
  this_00 = local_430;
  std::
  make_shared<slang::ast::builtins::RealMath2Function<&hypot>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            (__args,__args_1);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::RealMath2Function<&hypot>,void>
            (this_00,(shared_ptr<slang::ast::builtins::RealMath2Function<&hypot>_> *)
                     in_stack_fffffffffffffa08);
  addSystemSubroutine(this_01,subroutine);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x764732);
  std::shared_ptr<slang::ast::builtins::RealMath2Function<&hypot>_>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::RealMath2Function<&hypot>_> *)0x76473f);
  return;
}

Assistant:

void Builtins::registerMathFuncs() {
    using parsing::KnownSystemName;

    addSystemSubroutine(std::make_shared<Clog2Function>());
    addSystemSubroutine(std::make_shared<CountBitsFunction>());
    addSystemSubroutine(std::make_shared<CountOnesFunction>());

#define REGISTER(name, kind) \
    addSystemSubroutine(     \
        std::make_shared<BooleanBitVectorFunction>(name, BooleanBitVectorFunction::kind))

    REGISTER(KnownSystemName::OneHot, OneHot);
    REGISTER(KnownSystemName::OneHot0, OneHot0);
    REGISTER(KnownSystemName::IsUnknown, IsUnknown);

#undef REGISTER
#define REGISTER(name, func) \
    addSystemSubroutine(std::make_shared<RealMath1Function<(func)>>(*this, name))

    REGISTER(KnownSystemName::Ln, std::log);
    REGISTER(KnownSystemName::Log10, std::log10);
    REGISTER(KnownSystemName::Exp, std::exp);
    REGISTER(KnownSystemName::Sqrt, std::sqrt);
    REGISTER(KnownSystemName::Floor, std::floor);
    REGISTER(KnownSystemName::Ceil, std::ceil);
    REGISTER(KnownSystemName::Sin, std::sin);
    REGISTER(KnownSystemName::Cos, std::cos);
    REGISTER(KnownSystemName::Tan, std::tan);
    REGISTER(KnownSystemName::Asin, std::asin);
    REGISTER(KnownSystemName::Acos, std::acos);
    REGISTER(KnownSystemName::Atan, std::atan);
    REGISTER(KnownSystemName::Sinh, std::sinh);
    REGISTER(KnownSystemName::Cosh, std::cosh);
    REGISTER(KnownSystemName::Tanh, std::tanh);
    REGISTER(KnownSystemName::Asinh, std::asinh);
    REGISTER(KnownSystemName::Acosh, std::acosh);
    REGISTER(KnownSystemName::Atanh, std::atanh);

#undef REGISTER
#define REGISTER(name, func) \
    addSystemSubroutine(std::make_shared<RealMath2Function<(func)>>(*this, name))

    REGISTER(KnownSystemName::Pow, std::pow);
    REGISTER(KnownSystemName::Atan2, std::atan2);
    REGISTER(KnownSystemName::Hypot, std::hypot);

#undef REGISTER
}